

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qunicodetools.cpp
# Opt level: O3

void QUnicodeTools::Tailored::thaiAttributes
               (Script script,char16_t *text,qsizetype from,qsizetype len,
               QCharAttributes *attributes)

{
  char16_t cVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai> *this;
  char cVar8;
  QCharAttributes *pQVar9;
  size_t allocSize;
  size_t totalCapacity_1;
  long in_FS_OFFSET;
  undefined2 local_2f3;
  undefined1 local_2f1;
  ulong local_2f0;
  qsizetype local_2e8;
  undefined1 *local_2e0;
  undefined1 local_2d8 [512];
  size_t local_d8;
  size_t local_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [136];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_c0,0xaa,0x88);
  sVar4 = len + 1;
  local_d8 = 0x81;
  local_d0 = 0;
  local_c8 = local_c0;
  if (len < 0x81) {
    local_d0 = sVar4;
    memset(local_2d8,0xaa,0x200);
    local_2f0 = 0x80;
    local_2e0 = local_2d8;
LAB_0033e315:
    local_2f3 = 0xaaaa;
    local_2f1 = 0xaa;
    local_2e8 = len;
    if (-2 < (char)QtGlobalStatic::
                   Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::guard.
                   _q_value.super___atomic_base<signed_char>._M_i) {
      if (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
          ::instance()::holder == '\0') {
        this = (Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai> *)
               &QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                ::instance()::holder;
        iVar2 = __cxa_guard_acquire();
        if (iVar2 != 0) {
          QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::
          Holder(this);
          __cxa_atexit(QtGlobalStatic::
                       Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>::
                       ~Holder,QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                               ::instance()::holder,&__dso_handle);
          __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                               ::instance()::holder);
        }
      }
      if (((QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
            ::instance()::holder._32_8_ != 0) &&
          (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
           ::instance()::holder._40_8_ != 0)) &&
         (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
          ::instance()::holder._24_8_ != 0)) {
        pQVar9 = attributes + from;
        if (len < 1) {
          local_c8[len] = 0;
        }
        else {
          lVar5 = 0;
          do {
            cVar1 = text[from + lVar5];
            cVar8 = (char)cVar1 + -0x60;
            if (0x5a < (ushort)(cVar1 + L'\xf1ff')) {
              cVar8 = -1;
            }
            if ((ushort)cVar1 < 0xa1) {
              cVar8 = (char)cVar1;
            }
            local_c8[lVar5] = cVar8;
            lVar5 = lVar5 + 1;
          } while (len != lVar5);
          local_c8[len] = 0;
          lVar5 = 0;
          do {
            pQVar9[lVar5] = (QCharAttributes)((byte)pQVar9[lVar5] & 0x95);
            lVar5 = lVar5 + 1;
          } while (len != lVar5);
        }
        *pQVar9 = (QCharAttributes)((byte)*pQVar9 & 0x9d | 0x22);
        iVar2 = (*(code *)QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                          ::instance()::holder._32_8_)
                          (QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                           ::instance()::holder._24_8_,local_c8,local_2e0,local_2e8);
        if (0 < iVar2) {
          lVar5 = 0;
          do {
            pQVar9[*(int *)(local_2e0 + lVar5 * 4)] =
                 (QCharAttributes)((byte)pQVar9[*(int *)(local_2e0 + lVar5 * 4)] | 2);
            pQVar9[*(int *)(local_2e0 + lVar5 * 4)] =
                 (QCharAttributes)((byte)pQVar9[*(int *)(local_2e0 + lVar5 * 4)] | 0x20);
            pQVar9[*(int *)(local_2e0 + lVar5 * 4)] =
                 (QCharAttributes)((byte)pQVar9[*(int *)(local_2e0 + lVar5 * 4)] | 0x40);
            pQVar9[*(int *)(local_2e0 + lVar5 * 4)] =
                 (QCharAttributes)((byte)pQVar9[*(int *)(local_2e0 + lVar5 * 4)] | 8);
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
          pQVar9[*(int *)(local_2e0 + (long)iVar2 * 4 + -4)] =
               (QCharAttributes)((byte)pQVar9[*(int *)(local_2e0 + (long)iVar2 * 4 + -4)] & 0xdf);
        }
        if (0 < len) {
          lVar5 = 0;
          do {
            uVar7 = (*(code *)QGlobalStatic<QtGlobalStatic::Holder<QUnicodeTools::Tailored::(anonymous_namespace)::Q_QGS_g_libThai>>
                              ::instance()::holder._40_8_)
                              (local_c8 + lVar5,len - lVar5,&local_2f3,1);
            pQVar9[lVar5] = (QCharAttributes)((byte)pQVar9[lVar5] | 1);
            if (1 < uVar7) {
              uVar6 = 1;
              do {
                pQVar9[uVar6 + lVar5] = (QCharAttributes)((byte)pQVar9[uVar6 + lVar5] & 0xfe);
                uVar6 = uVar6 + 1;
              } while (uVar7 != uVar6);
            }
            lVar5 = lVar5 + uVar7;
          } while (lVar5 < len);
        }
      }
    }
    if (local_2e0 != local_2d8) {
      QtPrivate::sizedFree(local_2e0,local_2f0 << 2);
    }
    if (local_c8 != local_c0) {
      QtPrivate::sizedFree(local_c8,local_d8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    local_d8 = sVar4;
    sVar3 = QtPrivate::expectedAllocSize(sVar4,0x10);
    if (sVar3 == 0) {
      sVar3 = sVar4;
    }
    local_c8 = (undefined1 *)malloc(sVar3);
    local_d8 = sVar3;
    if (local_c8 == (undefined1 *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_0033e60a;
    }
    local_d0 = sVar4;
    memset(local_2d8,0xaa,0x200);
    local_2e8 = 0;
    uVar7 = len;
    if ((ulong)len >> 0x3e == 0) {
      sVar4 = len * 4;
      local_2f0 = len;
      local_2e0 = local_2d8;
      sVar3 = QtPrivate::expectedAllocSize(sVar4,0x10);
      if (sVar3 != 0) {
        uVar7 = sVar3 >> 2;
        sVar4 = sVar3 & 0xfffffffffffffffc;
        if (sVar4 == 0) goto LAB_0033e4fa;
      }
      local_2e0 = (undefined1 *)malloc(sVar4);
      local_2f0 = uVar7;
      if (local_2e0 != (undefined1 *)0x0) goto LAB_0033e315;
    }
    else {
LAB_0033e4fa:
      local_2e0 = (undefined1 *)0x0;
      local_2f0 = uVar7;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      qBadAlloc();
    }
  }
LAB_0033e60a:
  __stack_chk_fail();
}

Assistant:

static void thaiAttributes(QChar::Script script, const char16_t *text, qsizetype from, qsizetype len, QCharAttributes *attributes)
{
    assert(script == QChar::Script_Thai);
#if QT_CONFIG(library)
    const char16_t *uc = text + from;
    attributes += from;
    Q_UNUSED(script);
    thaiAssignAttributes(uc, len, attributes);
#else
    Q_UNUSED(script);
    Q_UNUSED(text);
    Q_UNUSED(from);
    Q_UNUSED(len);
    Q_UNUSED(attributes);
#endif
}